

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::elemental_vector::increase_capacity
          (elemental_vector *this,uint32 min_new_capacity,bool grow_hint,uint32 element_size,
          object_mover pMover)

{
  bool bVar1;
  void *pvVar2;
  void *new_p_1;
  void *new_p;
  size_t actual_size;
  uint32 desired_size;
  uint32 new_capacity;
  object_mover pMover_local;
  undefined1 local_1d;
  uint32 element_size_local;
  bool grow_hint_local;
  elemental_vector *peStack_18;
  uint32 min_new_capacity_local;
  elemental_vector *this_local;
  
  if (this->m_capacity < min_new_capacity) {
    actual_size._4_4_ = min_new_capacity;
    _desired_size = pMover;
    pMover_local._4_4_ = element_size;
    local_1d = grow_hint;
    element_size_local = min_new_capacity;
    peStack_18 = this;
    if ((grow_hint) && (bVar1 = math::is_power_of_2(min_new_capacity), !bVar1)) {
      actual_size._4_4_ = math::next_pow2(actual_size._4_4_);
    }
    actual_size._0_4_ = pMover_local._4_4_ * actual_size._4_4_;
    if (_desired_size == (object_mover)0x0) {
      pvVar2 = crnd_realloc(this->m_p,(ulong)(uint)actual_size,(size_t *)&new_p,true);
      if (pvVar2 == (void *)0x0) {
        return false;
      }
      this->m_p = pvVar2;
    }
    else {
      pvVar2 = crnd_malloc((ulong)(uint)actual_size,(size_t *)&new_p);
      if (pvVar2 == (void *)0x0) {
        return false;
      }
      (*_desired_size)(pvVar2,this->m_p,this->m_size);
      if (this->m_p != (void *)0x0) {
        crnd_free(this->m_p);
      }
      this->m_p = pvVar2;
    }
    if ((void *)(ulong)(uint)actual_size < new_p) {
      this->m_capacity = (uint32)((ulong)new_p / (ulong)pMover_local._4_4_);
    }
    else {
      this->m_capacity = actual_size._4_4_;
    }
  }
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint32 min_new_capacity, bool grow_hint, uint32 element_size, object_mover pMover)
    {
        CRND_ASSERT(m_size <= m_capacity);
        CRND_ASSERT(min_new_capacity < (0x7FFF0000U / element_size));

        if (m_capacity >= min_new_capacity)
            return true;

        uint32 new_capacity = min_new_capacity;
        if ((grow_hint) && (!math::is_power_of_2(new_capacity)))
            new_capacity = math::next_pow2(new_capacity);

        CRND_ASSERT(new_capacity && (new_capacity > m_capacity));

        const uint32 desired_size = element_size * new_capacity;
        size_t actual_size;
        if (!pMover)
        {
            void* new_p = crnd_realloc(m_p, desired_size, &actual_size, true);
            if (!new_p)
                return false;
            m_p = new_p;
        }
        else
        {
            void* new_p = crnd_malloc(desired_size, &actual_size);
            if (!new_p)
                return false;

            (*pMover)(new_p, m_p, m_size);

            if (m_p)
                crnd_free(m_p);

            m_p = new_p;
        }

        if (actual_size > desired_size)
            m_capacity = static_cast<uint32>(actual_size / element_size);
        else
            m_capacity = new_capacity;

        return true;
    }